

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

bool __thiscall crnlib::crn_comp::pack_data_models(crn_comp *this)

{
  uint uVar1;
  uchar *puVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  static_huffman_data_model *model;
  symbol_codec codec;
  symbol_codec sStack_b8;
  
  symbol_codec::symbol_codec(&sStack_b8);
  symbol_codec::start_encoding(&sStack_b8,0x100000);
  uVar3 = symbol_codec::encode_transmit_static_huffman_data_model
                    (&sStack_b8,&this->m_reference_dm,false,(static_huffman_data_model *)0x0);
  if (uVar3 == 0) {
LAB_001626c1:
    bVar4 = false;
  }
  else {
    model = (static_huffman_data_model *)&this->field_0x2690;
    lVar5 = 1;
    do {
      if (model->m_total_syms != 0) {
        uVar3 = symbol_codec::encode_transmit_static_huffman_data_model
                          (&sStack_b8,model,false,(static_huffman_data_model *)0x0);
        if (uVar3 == 0) goto LAB_001626c1;
      }
      if (*(int *)&model[3].m_codes.m_p != 0) {
        uVar3 = symbol_codec::encode_transmit_static_huffman_data_model
                          (&sStack_b8,(static_huffman_data_model *)&model[3].m_codes,false,
                           (static_huffman_data_model *)0x0);
        if (uVar3 == 0) goto LAB_001626c1;
      }
      model = model + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 == 0);
    symbol_codec::stop_encoding(&sStack_b8,false);
    puVar2 = (this->m_packed_data_models).m_p;
    (this->m_packed_data_models).m_p = sStack_b8.m_output_buf.m_p;
    uVar3 = (this->m_packed_data_models).m_size;
    (this->m_packed_data_models).m_size = sStack_b8.m_output_buf.m_size;
    uVar1 = (this->m_packed_data_models).m_capacity;
    (this->m_packed_data_models).m_capacity = sStack_b8.m_output_buf.m_capacity;
    bVar4 = true;
    sStack_b8.m_output_buf.m_p = puVar2;
    sStack_b8.m_output_buf.m_size = uVar3;
    sStack_b8.m_output_buf.m_capacity = uVar1;
  }
  if (sStack_b8.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(sStack_b8.m_output_syms.m_p);
  }
  if (sStack_b8.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(sStack_b8.m_arith_output_buf.m_p);
  }
  if (sStack_b8.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(sStack_b8.m_output_buf.m_p);
  }
  return bVar4;
}

Assistant:

bool crn_comp::pack_data_models() {
  symbol_codec codec;
  codec.start_encoding(1024 * 1024);

  if (!codec.encode_transmit_static_huffman_data_model(m_reference_dm, false))
    return false;

  for (uint i = 0; i < 2; i++) {
    if (m_endpoint_index_dm[i].get_total_syms()) {
      if (!codec.encode_transmit_static_huffman_data_model(m_endpoint_index_dm[i], false))
        return false;
    }

    if (m_selector_index_dm[i].get_total_syms()) {
      if (!codec.encode_transmit_static_huffman_data_model(m_selector_index_dm[i], false))
        return false;
    }
  }

  codec.stop_encoding(false);

  m_packed_data_models.swap(codec.get_encoding_buf());

  return true;
}